

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool array_run_container_intersect(array_container_t *src_1,run_container_t *src_2)

{
  _Bool _Var1;
  rle16_t local_2c;
  int32_t iStack_28;
  uint16_t arrayval;
  rle16_t rle;
  int32_t arraypos;
  int32_t rlepos;
  run_container_t *src_2_local;
  array_container_t *src_1_local;
  
  _Var1 = run_container_is_full(src_2);
  if (_Var1) {
    _Var1 = array_container_empty(src_1);
    src_1_local._7_1_ = (_Bool)((_Var1 ^ 0xffU) & 1);
  }
  else if (src_2->n_runs == 0) {
    src_1_local._7_1_ = false;
  }
  else {
    rle.value = 0;
    rle.length = 0;
    iStack_28 = 0;
    local_2c = *src_2->runs;
    for (; iStack_28 < src_1->cardinality;
        iStack_28 = advanceUntil(src_1->array,iStack_28,src_1->cardinality,local_2c.value)) {
      while (((uint)local_2c & 0xffff) + ((uint)local_2c >> 0x10) < (uint)src_1->array[iStack_28]) {
        rle = (rle16_t)((int)rle + 1);
        if (rle == (rle16_t)src_2->n_runs) {
          return false;
        }
        local_2c = src_2->runs[(int)rle];
      }
      if (((uint)local_2c & 0xffff) <= (uint)src_1->array[iStack_28]) {
        return true;
      }
    }
    src_1_local._7_1_ = false;
  }
  return src_1_local._7_1_;
}

Assistant:

bool array_run_container_intersect(const array_container_t *src_1,
                                      const run_container_t *src_2) {
	if( run_container_is_full(src_2) ) {
	    return !array_container_empty(src_1);
	}
	if (src_2->n_runs == 0) {
        return false;
    }
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    rle16_t rle = src_2->runs[rlepos];
    while (arraypos < src_1->cardinality) {
        const uint16_t arrayval = src_1->array[arraypos];
        while (rle.value + rle.length <
               arrayval) {  // this will frequently be false
            ++rlepos;
            if (rlepos == src_2->n_runs) {
                return false;  // we are done
            }
            rle = src_2->runs[rlepos];
        }
        if (rle.value > arrayval) {
            arraypos = advanceUntil(src_1->array, arraypos, src_1->cardinality,
                                    rle.value);
        } else {
            return true;
        }
    }
    return false;
}